

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merlin.cpp
# Opt level: O2

bool __thiscall Merlin::read_evidence(Merlin *this,string *evidence)

{
  size_t sVar1;
  istream *piVar2;
  mapped_type *pmVar3;
  runtime_error *this_00;
  int i;
  int iVar4;
  int num_evid;
  size_t val;
  string err_msg;
  istringstream in;
  byte abStack_190 [352];
  
  std::__cxx11::istringstream::istringstream((istringstream *)&in,(string *)evidence,_S_in);
  if ((abStack_190[*(long *)(_in + -0x18)] & 5) == 0) {
    std::
    _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::_Select1st<std::pair<const_unsigned_long,_unsigned_long>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
    ::clear(&(this->m_evidence)._M_t);
    std::istream::operator>>(&in,&num_evid);
    for (iVar4 = 0; iVar4 < num_evid; iVar4 = iVar4 + 1) {
      piVar2 = std::istream::_M_extract<unsigned_long>((ulong *)&in);
      std::istream::_M_extract<unsigned_long>((ulong *)piVar2);
      sVar1 = val;
      pmVar3 = std::
               map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
               ::operator[](&this->m_evidence,(key_type *)&err_msg);
      *pmVar3 = sVar1;
    }
    std::__cxx11::istringstream::~istringstream((istringstream *)&in);
    return true;
  }
  std::__cxx11::string::string
            ((string *)&err_msg,"Cannot open the evidence string",(allocator *)&val);
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,(string *)&err_msg);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

bool Merlin::read_evidence(std::string evidence) {
	try {

		// Open the evidence file
		std::istringstream in(evidence);
		if (in.fail()) {
			std::string err_msg("Cannot open the evidence string");
			throw std::runtime_error(err_msg);
		}

		// Clear any previous evidence
		m_evidence.clear();

		// Read the evidence file
		int num_evid;
		in >> num_evid;
		for (int i = 0; i < num_evid; ++i) {
			vindex var;
			size_t val;
			in >> var >> val;
			m_evidence[var] = val;
		}

		return true;
	} catch (const std::runtime_error& e) {
		std::cerr << e.what() << std::endl;
		return false;
	}
}